

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_1::multiplePatchReferenceVertexCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *levels,int numPatches)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  
  iVar3 = 0;
  lVar2 = 10;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    iVar1 = referenceVertexCount(primitiveType,spacingMode,usePointMode,levels,levels + 2);
    iVar3 = iVar3 + iVar1;
    levels = levels + 6;
  }
  return iVar3;
}

Assistant:

static int multiplePatchReferenceVertexCount (TessPrimitiveType primitiveType, SpacingMode spacingMode, bool usePointMode, const float* levels, int numPatches)
{
	int result = 0;
	for (int patchNdx = 0; patchNdx < numPatches; patchNdx++)
		result += referenceVertexCount(primitiveType, spacingMode, usePointMode, &levels[6*patchNdx + 0], &levels[6*patchNdx + 2]);
	return result;
}